

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
  *psVar5;
  rep rVar6;
  int *piVar7;
  _Elt_pointer piVar8;
  int i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  inline_timer local_98;
  
  psVar5 = perf::inline_timer_stack();
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/example/inline.cpp"
             ,"");
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
  paVar1 = &local_98.m_file.field_2;
  local_98.m_start.__d.__r = (duration)0;
  local_98.m_stop.__d.__r = (duration)0;
  if (local_b8 == &local_a8) {
    local_98.m_file.field_2._8_8_ = local_a8._8_8_;
    local_98.m_file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.m_file._M_dataplus._M_p = (pointer)local_b8;
  }
  local_98.m_file.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_98.m_file.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  paVar2 = &local_98.m_function.field_2;
  local_98.m_file._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98.m_first_line = 0x23;
  local_98.m_last_line = 0x23;
  if (local_d8 == &local_c8) {
    local_98.m_function.field_2._8_8_ = local_c8._8_8_;
    local_98.m_function._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.m_function._M_dataplus._M_p = (pointer)local_d8;
  }
  local_98.m_function.field_2._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
  local_98.m_function.field_2._M_local_buf[0] = local_c8._M_local_buf[0];
  local_98.m_function._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_d8 = &local_c8;
  local_b8 = &local_a8;
  std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::
  emplace_back<perf::inline_timer>(&psVar5->c,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_function._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.m_function._M_dataplus._M_p,
                    local_98.m_function.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_file._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_file._M_dataplus._M_p,
                    local_98.m_file.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0])
                             + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  psVar5 = perf::inline_timer_stack();
  piVar8 = (psVar5->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar8 == (psVar5->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar8 = (psVar5->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  rVar6 = std::chrono::_V2::system_clock::now();
  piVar8[-1].m_start.__d.__r = rVar6;
  local_98._0_8_ = 0;
  local_98.m_start.__d.__r = (duration)20000000;
  do {
    iVar3 = nanosleep((timespec *)&local_98,(timespec *)&local_98);
    if (iVar3 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  psVar5 = perf::inline_timer_stack();
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/example/inline.cpp"
             ,"");
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"main","");
  local_98.m_start.__d.__r = (duration)0;
  local_98.m_stop.__d.__r = (duration)0;
  if (local_f8 == &local_e8) {
    local_98.m_file.field_2._8_8_ = local_e8._8_8_;
    local_98.m_file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.m_file._M_dataplus._M_p = (pointer)local_f8;
  }
  local_98.m_file.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_98.m_file.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_98.m_file._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_98.m_first_line = 0x26;
  local_98.m_last_line = 0x26;
  if (local_118 == &local_108) {
    local_98.m_function.field_2._8_8_ = local_108._8_8_;
    local_98.m_function._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.m_function._M_dataplus._M_p = (pointer)local_118;
  }
  local_98.m_function.field_2._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
  local_98.m_function.field_2._M_local_buf[0] = local_108._M_local_buf[0];
  local_98.m_function._M_string_length = local_110;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_118 = &local_108;
  local_f8 = &local_e8;
  std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::
  emplace_back<perf::inline_timer>(&psVar5->c,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_function._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.m_function._M_dataplus._M_p,
                    local_98.m_function.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_file._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_file._M_dataplus._M_p,
                    local_98.m_file.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  psVar5 = perf::inline_timer_stack();
  piVar8 = (psVar5->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar8 == (psVar5->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar8 = (psVar5->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  rVar6 = std::chrono::_V2::system_clock::now();
  piVar8[-1].m_start.__d.__r = rVar6;
  iVar3 = 0;
  do {
    local_98._0_8_ = 0;
    local_98.m_start.__d.__r = (duration)20000000;
    do {
      iVar4 = nanosleep((timespec *)&local_98,(timespec *)&local_98);
      if (iVar4 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    iVar3 = iVar3 + 1;
    if (iVar3 == 10) {
      psVar5 = perf::inline_timer_stack();
      piVar8 = (psVar5->c).
               super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar8 == (psVar5->c).
                    super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar8 = (psVar5->c).
                 super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      rVar6 = std::chrono::_V2::system_clock::now();
      piVar8[-1].m_stop.__d.__r = rVar6;
      psVar5 = perf::inline_timer_stack();
      piVar8 = (psVar5->c).
               super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar8 == (psVar5->c).
                    super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar8 = (psVar5->c).
                 super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      if (piVar8[-1].m_first_line < 0x2b) {
        piVar8[-1].m_last_line = 0x2b;
      }
      psVar5 = perf::inline_timer_stack();
      piVar8 = (psVar5->c).
               super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar8 == (psVar5->c).
                    super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar8 = (psVar5->c).
                 super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      perf::operator<<((ostream *)&std::cout,piVar8 + -1);
      local_98._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      psVar5 = perf::inline_timer_stack();
      std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::pop_back(&psVar5->c);
      psVar5 = perf::inline_timer_stack();
      piVar8 = (psVar5->c).
               super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar8 == (psVar5->c).
                    super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar8 = (psVar5->c).
                 super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      rVar6 = std::chrono::_V2::system_clock::now();
      piVar8[-1].m_stop.__d.__r = rVar6;
      psVar5 = perf::inline_timer_stack();
      piVar8 = (psVar5->c).
               super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar8 == (psVar5->c).
                    super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar8 = (psVar5->c).
                 super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      if (piVar8[-1].m_first_line < 0x2d) {
        piVar8[-1].m_last_line = 0x2d;
      }
      psVar5 = perf::inline_timer_stack();
      piVar8 = (psVar5->c).
               super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar8 == (psVar5->c).
                    super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar8 = (psVar5->c).
                 super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      perf::operator<<((ostream *)&std::cout,piVar8 + -1);
      local_98._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      psVar5 = perf::inline_timer_stack();
      std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::pop_back(&psVar5->c);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    PERF_START();
    std::this_thread::sleep_for(perf::milliseconds(20));

    PERF_START();
    for (int i = 0; i < 10; i++)
    {
        std::this_thread::sleep_for(perf::milliseconds(20));
    }
    PERF_STOP();

    PERF_STOP();

    return 0;
}